

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NodeFindFanin(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if ((pNode->vFanins).nSize <= lVar1) {
      return -1;
    }
    if ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar1]] == pFanin) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int Abc_NodeFindFanin( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pThis;
    int i;
    Abc_ObjForEachFanin( pNode, pThis, i )
        if ( pThis == pFanin )
            return i;
    return -1;
}